

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompositionfunctions.cpp
# Opt level: O3

void comp_func_XOR_rgb64(QRgba64 *dest,QRgba64 *src,int length,uint const_alpha)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  unkbyte10 Var28;
  int iVar29;
  ulong uVar30;
  __m128i va;
  undefined1 auVar31 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar51;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar52;
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  
  if (const_alpha == 0xff) {
    if (0 < length) {
      uVar30 = 0;
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      do {
        uVar1 = dest[uVar30].rgba;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar1;
        uVar2 = src[uVar30].rgba;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar2;
        auVar32 = pshuflw(in_XMM3,auVar38,0xff);
        auVar32 = auVar32 ^ auVar31;
        auVar34 = pshuflw(in_XMM4,auVar37,0xff);
        auVar34 = auVar34 ^ auVar31;
        uVar51 = auVar34._6_2_ * (short)(uVar2 >> 0x30);
        auVar45._0_12_ = ZEXT212(uVar51) << 0x30;
        auVar35 = pmulhuw(auVar34,auVar38);
        auVar45._12_2_ = uVar51;
        auVar45._14_2_ = auVar35._6_2_;
        auVar44._12_4_ = auVar45._12_4_;
        auVar44._0_10_ = (unkuint10)uVar51 << 0x30;
        auVar44._10_2_ = auVar35._4_2_;
        Var28 = CONCAT64(auVar44._10_6_,CONCAT22(auVar34._4_2_ * (short)(uVar2 >> 0x20),uVar51));
        auVar18._4_8_ = (long)((unkuint10)Var28 >> 0x10);
        auVar18._2_2_ = auVar35._2_2_;
        auVar18._0_2_ = auVar34._2_2_ * (short)(uVar2 >> 0x10);
        auVar3._10_2_ = 0;
        auVar3._0_10_ = auVar35._0_10_;
        auVar3._12_2_ = auVar35._6_2_;
        auVar8._8_2_ = auVar35._4_2_;
        auVar8._0_8_ = auVar35._0_8_;
        auVar8._10_4_ = auVar3._10_4_;
        auVar19._6_8_ = 0;
        auVar19._0_6_ = auVar8._8_6_;
        auVar13._4_2_ = auVar35._2_2_;
        auVar13._0_4_ = auVar35._0_4_;
        auVar13._6_8_ = SUB148(auVar19 << 0x40,6);
        auVar36._0_4_ =
             (int)((auVar35._0_4_ & 0xffff) + CONCAT22(auVar35._0_2_,auVar34._0_2_ * (short)uVar2) +
                  0x8000) >> 0x10;
        auVar36._4_4_ = auVar13._4_4_ + auVar18._0_4_ + 0x8000 >> 0x10;
        auVar36._8_4_ = auVar8._8_4_ + (int)((unkuint10)Var28 >> 0x10) + 0x8000 >> 0x10;
        auVar36._12_4_ = (int)((auVar3._10_4_ >> 0x10) + auVar44._12_4_ + 0x8000) >> 0x10;
        in_XMM4 = packssdw(auVar36,auVar36);
        uVar51 = auVar32._6_2_ * (short)(uVar1 >> 0x30);
        auVar40._0_12_ = ZEXT212(uVar51) << 0x30;
        auVar34 = pmulhuw(auVar32,auVar37);
        auVar40._12_2_ = uVar51;
        auVar40._14_2_ = auVar34._6_2_;
        auVar39._12_4_ = auVar40._12_4_;
        auVar39._0_10_ = (unkuint10)uVar51 << 0x30;
        auVar39._10_2_ = auVar34._4_2_;
        Var28 = CONCAT64(auVar39._10_6_,CONCAT22(auVar32._4_2_ * (short)(uVar1 >> 0x20),uVar51));
        auVar20._4_8_ = (long)((unkuint10)Var28 >> 0x10);
        auVar20._2_2_ = auVar34._2_2_;
        auVar20._0_2_ = auVar32._2_2_ * (short)(uVar1 >> 0x10);
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar34._0_10_;
        auVar4._12_2_ = auVar34._6_2_;
        auVar9._8_2_ = auVar34._4_2_;
        auVar9._0_8_ = auVar34._0_8_;
        auVar9._10_4_ = auVar4._10_4_;
        auVar21._6_8_ = 0;
        auVar21._0_6_ = auVar9._8_6_;
        auVar14._4_2_ = auVar34._2_2_;
        auVar14._0_4_ = auVar34._0_4_;
        auVar14._6_8_ = SUB148(auVar21 << 0x40,6);
        auVar33._0_4_ =
             (int)((auVar34._0_4_ & 0xffff) + CONCAT22(auVar34._0_2_,auVar32._0_2_ * (short)uVar1) +
                  0x8000) >> 0x10;
        auVar33._4_4_ = auVar14._4_4_ + auVar20._0_4_ + 0x8000 >> 0x10;
        auVar33._8_4_ = auVar9._8_4_ + (int)((unkuint10)Var28 >> 0x10) + 0x8000 >> 0x10;
        auVar33._12_4_ = (int)((auVar4._10_4_ >> 0x10) + auVar39._12_4_ + 0x8000) >> 0x10;
        auVar32 = packssdw(auVar33,auVar33);
        in_XMM3._0_8_ =
             CONCAT26(auVar32._6_2_ + in_XMM4._6_2_,
                      CONCAT24(auVar32._4_2_ + in_XMM4._4_2_,
                               CONCAT22(auVar32._2_2_ + in_XMM4._2_2_,auVar32._0_2_ + in_XMM4._0_2_)
                              ));
        in_XMM3._8_2_ = auVar32._8_2_ + in_XMM4._8_2_;
        in_XMM3._10_2_ = auVar32._10_2_ + in_XMM4._10_2_;
        in_XMM3._12_2_ = auVar32._12_2_ + in_XMM4._12_2_;
        in_XMM3._14_2_ = auVar32._14_2_ + in_XMM4._14_2_;
        dest[uVar30].rgba = in_XMM3._0_8_;
        uVar30 = uVar30 + 1;
      } while ((uint)length != uVar30);
    }
  }
  else if (0 < length) {
    auVar31 = ZEXT416((const_alpha & 0xff) << 8 | const_alpha & 0xff);
    auVar31 = pshuflw(auVar31,auVar31,0);
    uVar30 = 0;
    auVar32._8_4_ = 0xffffffff;
    auVar32._0_8_ = 0xffffffffffffffff;
    auVar32._12_4_ = 0xffffffff;
    do {
      uVar1 = dest[uVar30].rgba;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar1;
      uVar2 = src[uVar30].rgba;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar2;
      uVar51 = auVar31._6_2_ * (short)(uVar2 >> 0x30);
      auVar35._0_12_ = ZEXT212(uVar51) << 0x30;
      auVar47 = pmulhuw(auVar46,auVar31);
      auVar35._12_2_ = uVar51;
      auVar35._14_2_ = auVar47._6_2_;
      auVar41._12_4_ = auVar35._12_4_;
      auVar41._0_10_ = (unkuint10)uVar51 << 0x30;
      auVar41._10_2_ = auVar47._4_2_;
      Var28 = CONCAT64(auVar41._10_6_,CONCAT22(auVar31._4_2_ * (short)(uVar2 >> 0x20),uVar51));
      auVar22._4_8_ = (long)((unkuint10)Var28 >> 0x10);
      auVar22._2_2_ = auVar47._2_2_;
      auVar22._0_2_ = auVar31._2_2_ * (short)(uVar2 >> 0x10);
      auVar42._0_4_ = CONCAT22(auVar47._0_2_,auVar31._0_2_ * (short)uVar2);
      auVar42._4_12_ = auVar22;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar47._0_10_;
      auVar5._12_2_ = auVar47._6_2_;
      auVar10._8_2_ = auVar47._4_2_;
      auVar10._0_8_ = auVar47._0_8_;
      auVar10._10_4_ = auVar5._10_4_;
      auVar23._6_8_ = 0;
      auVar23._0_6_ = auVar10._8_6_;
      auVar15._4_2_ = auVar47._2_2_;
      auVar15._0_4_ = auVar47._0_4_;
      auVar15._6_8_ = SUB148(auVar23 << 0x40,6);
      auVar48._0_4_ = (int)((auVar47._0_4_ & 0xffff) + auVar42._0_4_ + 0x8000) >> 0x10;
      auVar48._4_4_ = auVar15._4_4_ + auVar22._0_4_ + 0x8000 >> 0x10;
      auVar48._8_4_ = auVar10._8_4_ + (int)((unkuint10)Var28 >> 0x10) + 0x8000 >> 0x10;
      auVar48._12_4_ = (int)((auVar5._10_4_ >> 0x10) + auVar41._12_4_ + 0x8000) >> 0x10;
      auVar47 = packssdw(auVar48,auVar48);
      auVar35 = pshuflw(auVar42,auVar47,0xff);
      auVar35 = auVar35 ^ auVar32;
      auVar41 = pshuflw(in_XMM6,auVar34,0xff);
      auVar41 = auVar41 ^ auVar32;
      sVar52 = auVar41._6_2_ * auVar47._6_2_;
      auVar42 = pmulhuw(auVar41,auVar47);
      iVar29 = CONCAT22(auVar42._6_2_,sVar52);
      Var28 = CONCAT64(CONCAT42(iVar29,auVar42._4_2_),CONCAT22(auVar41._4_2_ * auVar47._4_2_,sVar52)
                      );
      auVar24._4_8_ = (long)((unkuint10)Var28 >> 0x10);
      auVar24._2_2_ = auVar42._2_2_;
      auVar24._0_2_ = auVar41._2_2_ * auVar47._2_2_;
      auVar6._10_2_ = 0;
      auVar6._0_10_ = auVar42._0_10_;
      auVar6._12_2_ = auVar42._6_2_;
      auVar11._8_2_ = auVar42._4_2_;
      auVar11._0_8_ = auVar42._0_8_;
      auVar11._10_4_ = auVar6._10_4_;
      auVar25._6_8_ = 0;
      auVar25._0_6_ = auVar11._8_6_;
      auVar16._4_2_ = auVar42._2_2_;
      auVar16._0_4_ = auVar42._0_4_;
      auVar16._6_8_ = SUB148(auVar25 << 0x40,6);
      auVar43._0_4_ =
           (int)((auVar42._0_4_ & 0xffff) + CONCAT22(auVar42._0_2_,auVar41._0_2_ * auVar47._0_2_) +
                0x8000) >> 0x10;
      auVar43._4_4_ = auVar16._4_4_ + auVar24._0_4_ + 0x8000 >> 0x10;
      auVar43._8_4_ = auVar11._8_4_ + (int)((unkuint10)Var28 >> 0x10) + 0x8000 >> 0x10;
      auVar43._12_4_ = (int)((auVar6._10_4_ >> 0x10) + iVar29 + 0x8000) >> 0x10;
      in_XMM6 = packssdw(auVar43,auVar43);
      uVar51 = auVar35._6_2_ * (short)(uVar1 >> 0x30);
      auVar50._0_12_ = ZEXT212(uVar51) << 0x30;
      auVar34 = pmulhuw(auVar35,auVar34);
      auVar50._12_2_ = uVar51;
      auVar50._14_2_ = auVar34._6_2_;
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._0_10_ = (unkuint10)uVar51 << 0x30;
      auVar49._10_2_ = auVar34._4_2_;
      Var28 = CONCAT64(auVar49._10_6_,CONCAT22(auVar35._4_2_ * (short)(uVar1 >> 0x20),uVar51));
      auVar26._4_8_ = (long)((unkuint10)Var28 >> 0x10);
      auVar26._2_2_ = auVar34._2_2_;
      auVar26._0_2_ = auVar35._2_2_ * (short)(uVar1 >> 0x10);
      auVar7._10_2_ = 0;
      auVar7._0_10_ = auVar34._0_10_;
      auVar7._12_2_ = auVar34._6_2_;
      auVar12._8_2_ = auVar34._4_2_;
      auVar12._0_8_ = auVar34._0_8_;
      auVar12._10_4_ = auVar7._10_4_;
      auVar27._6_8_ = 0;
      auVar27._0_6_ = auVar12._8_6_;
      auVar17._4_2_ = auVar34._2_2_;
      auVar17._0_4_ = auVar34._0_4_;
      auVar17._6_8_ = SUB148(auVar27 << 0x40,6);
      auVar47._0_4_ =
           (int)((auVar34._0_4_ & 0xffff) + CONCAT22(auVar34._0_2_,auVar35._0_2_ * (short)uVar1) +
                0x8000) >> 0x10;
      auVar47._4_4_ = auVar17._4_4_ + auVar26._0_4_ + 0x8000 >> 0x10;
      auVar47._8_4_ = auVar12._8_4_ + (int)((unkuint10)Var28 >> 0x10) + 0x8000 >> 0x10;
      auVar47._12_4_ = (int)((auVar7._10_4_ >> 0x10) + auVar49._12_4_ + 0x8000) >> 0x10;
      auVar34 = packssdw(auVar47,auVar47);
      dest[uVar30].rgba =
           CONCAT26(auVar34._6_2_ + in_XMM6._6_2_,
                    CONCAT24(auVar34._4_2_ + in_XMM6._4_2_,
                             CONCAT22(auVar34._2_2_ + in_XMM6._2_2_,auVar34._0_2_ + in_XMM6._0_2_)))
      ;
      uVar30 = uVar30 + 1;
    } while ((uint)length != uVar30);
  }
  return;
}

Assistant:

inline static void comp_func_XOR_template(typename Ops::Type *Q_DECL_RESTRICT dest,
                                          const typename Ops::Type *Q_DECL_RESTRICT src,
                                          int length, uint const_alpha)
{
    if (const_alpha == 255) {
        for (int i = 0; i < length; ++i) {
            auto d = Ops::load(&dest[i]);
            auto s = Ops::load(&src[i]);
            Ops::store(&dest[i], Ops::interpolate(s, Ops::invAlpha(d), d, Ops::invAlpha(s)));
        }
    } else {
        for (int i = 0; i < length; ++i) {
            auto d = Ops::load(&dest[i]);
            auto s = Ops::multiplyAlpha8bit(Ops::load(&src[i]), const_alpha);
            Ops::store(&dest[i], Ops::interpolate(s, Ops::invAlpha(d), d, Ops::invAlpha(s)));
        }
    }
}